

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test::
TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test
          (TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test *this)

{
  memset(this,0,0xa0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370b30;
  SimpleStringInternalCache::SimpleStringInternalCache
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache);
  MemoryAccountant::MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).accountant);
  ExecFunction::ExecFunction
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.
              super_ExecFunction);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)&PTR__ExecFunctionWithoutParameters_00370b70;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_003703f0;
  return;
}

Assistant:

TEST(SimpleStringInternalCache, allocationWillReuseTheAllocatedBlocks)
{
    cache.setAllocator(allocator);

    char* mem = cache.alloc(10);
    cache.dealloc(mem, 10);
    mem = cache.alloc(10);
    cache.dealloc(mem, 10);

    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(32));
}